

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

void xmlFreeAttribute(xmlAttributePtr attr)

{
  int iVar1;
  xmlDictPtr local_18;
  xmlDictPtr dict;
  xmlAttributePtr attr_local;
  
  if (attr != (xmlAttributePtr)0x0) {
    if (attr->doc == (_xmlDoc *)0x0) {
      local_18 = (xmlDictPtr)0x0;
    }
    else {
      local_18 = attr->doc->dict;
    }
    xmlUnlinkNode((xmlNodePtr)attr);
    if (attr->tree != (xmlEnumerationPtr)0x0) {
      xmlFreeEnumeration(attr->tree);
    }
    if (local_18 == (xmlDictPtr)0x0) {
      if (attr->elem != (xmlChar *)0x0) {
        (*xmlFree)(attr->elem);
      }
      if (attr->name != (xmlChar *)0x0) {
        (*xmlFree)(attr->name);
      }
      if (attr->defaultValue != (xmlChar *)0x0) {
        (*xmlFree)(attr->defaultValue);
      }
      if (attr->prefix != (xmlChar *)0x0) {
        (*xmlFree)(attr->prefix);
      }
    }
    else {
      if ((attr->elem != (xmlChar *)0x0) && (iVar1 = xmlDictOwns(local_18,attr->elem), iVar1 == 0))
      {
        (*xmlFree)(attr->elem);
      }
      if ((attr->name != (xmlChar *)0x0) && (iVar1 = xmlDictOwns(local_18,attr->name), iVar1 == 0))
      {
        (*xmlFree)(attr->name);
      }
      if ((attr->prefix != (xmlChar *)0x0) &&
         (iVar1 = xmlDictOwns(local_18,attr->prefix), iVar1 == 0)) {
        (*xmlFree)(attr->prefix);
      }
      if ((attr->defaultValue != (xmlChar *)0x0) &&
         (iVar1 = xmlDictOwns(local_18,attr->defaultValue), iVar1 == 0)) {
        (*xmlFree)(attr->defaultValue);
      }
    }
    (*xmlFree)(attr);
  }
  return;
}

Assistant:

static void
xmlFreeAttribute(xmlAttributePtr attr) {
    xmlDictPtr dict;

    if (attr == NULL) return;
    if (attr->doc != NULL)
	dict = attr->doc->dict;
    else
	dict = NULL;
    xmlUnlinkNode((xmlNodePtr) attr);
    if (attr->tree != NULL)
        xmlFreeEnumeration(attr->tree);
    if (dict) {
        if ((attr->elem != NULL) && (!xmlDictOwns(dict, attr->elem)))
	    xmlFree((xmlChar *) attr->elem);
        if ((attr->name != NULL) && (!xmlDictOwns(dict, attr->name)))
	    xmlFree((xmlChar *) attr->name);
        if ((attr->prefix != NULL) && (!xmlDictOwns(dict, attr->prefix)))
	    xmlFree((xmlChar *) attr->prefix);
        if ((attr->defaultValue != NULL) &&
	    (!xmlDictOwns(dict, attr->defaultValue)))
	    xmlFree((xmlChar *) attr->defaultValue);
    } else {
	if (attr->elem != NULL)
	    xmlFree((xmlChar *) attr->elem);
	if (attr->name != NULL)
	    xmlFree((xmlChar *) attr->name);
	if (attr->defaultValue != NULL)
	    xmlFree((xmlChar *) attr->defaultValue);
	if (attr->prefix != NULL)
	    xmlFree((xmlChar *) attr->prefix);
    }
    xmlFree(attr);
}